

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createmidifile2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  size_t __n;
  void *__buf;
  int iVar2;
  long lVar3;
  allocator local_c9;
  string local_c8;
  size_t local_a8;
  MidiFile midifile;
  
  smf::MidiFile::MidiFile(&midifile);
  smf::MidiFile::addTracks(&midifile,2);
  smf::MidiFile::setTicksPerQuarterNote(&midifile,0x78);
  std::__cxx11::string::string((string *)&local_c8,"Twinkle, Twinkle Little Star",&local_c9);
  smf::MidiFile::addTrackName(&midifile,0,0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  smf::MidiFile::addTempo(&midifile,0,0,104.0);
  std::__cxx11::string::string((string *)&local_c8,"Melody",&local_c9);
  smf::MidiFile::addTrackName(&midifile,1,0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  iVar2 = 0;
  smf::MidiFile::addPatchChange(&midifile,1,0,0,0x28);
  for (lVar3 = 0; lVar3 != 0x38; lVar3 = lVar3 + 4) {
    iVar1 = *(int *)((long)&DAT_00119010 + lVar3);
    smf::MidiFile::addNoteOn(&midifile,1,iVar2,0,iVar1,0x40);
    iVar2 = iVar2 + *(int *)((long)&DAT_001190e0 + lVar3) * 0x78;
    smf::MidiFile::addNoteOff(&midifile,1,iVar2,0,iVar1,0x40);
  }
  std::__cxx11::string::string((string *)&local_c8,"Bass line",&local_c9);
  smf::MidiFile::addTrackName(&midifile,2,0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  smf::MidiFile::addPatchChange(&midifile,2,0,1,0x3a);
  iVar2 = 0;
  __n = 0;
  while (__n != 0x3c) {
    iVar1 = *(int *)((long)&DAT_001191b0 + __n);
    local_a8 = __n;
    smf::MidiFile::addNoteOn(&midifile,2,iVar2,1,iVar1,0x5a);
    iVar2 = iVar2 + *(int *)(&DAT_00119280 + local_a8) * 0x78;
    smf::MidiFile::addNoteOff(&midifile,2,iVar2,1,iVar1,0x5a);
    __n = local_a8 + 4;
  }
  smf::MidiFile::sortTracks(&midifile);
  std::__cxx11::string::string((string *)&local_c8,"twinkle.mid",&local_c9);
  smf::MidiFile::write(&midifile,(int)&local_c8,__buf,__n);
  std::__cxx11::string::~string((string *)&local_c8);
  smf::MidiFile::~MidiFile(&midifile);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile midifile;
   midifile.addTracks(2);    // Add another two tracks to the MIDI file
   int tpq = 120;            // ticks per quarter note
   midifile.setTicksPerQuarterNote(tpq);

   // melody to write to MIDI track 1: (60 = middle C)
                  // C5   C  G  G  A  A  G- F  F  E  E  D  D  C-
   int melody[50]  = {72,72,79,79,81,81,79,77,77,76,76,74,74,72,-1};
   int mrhythm[50] = { 1, 1, 1, 1, 1, 1, 2, 1, 1, 1, 1, 1, 1, 2,-1};

                  // C3 C4  E  C  F  C  E  C  D B3 C4 A3  F  G  C-
   int bass[50] =   {48,60,64,60,65,60,64,60,62,59,60,57,53,55,48,-1};
   int brhythm[50]= { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 2,-1};

   int actiontick = 0;
   int track      = 0;

   // Add some expression track (track 0) messages:
   midifile.addTrackName(track, actiontick, "Twinkle, Twinkle Little Star");
   midifile.addTempo(track, actiontick, 104.0);

   // Store melody line in track 1
   int i = 0;
   int velocity   = 64;
   int channel    = 0;
   track          = 1;

   midifile.addTrackName(track, actiontick, "Melody");
   midifile.addPatchChange(track, actiontick, channel, 40); // 40=violin

   while (melody[i] >= 0) {
      midifile.addNoteOn(track, actiontick, channel, melody[i], velocity);
      actiontick += tpq * mrhythm[i];
      midifile.addNoteOff(track, actiontick, channel, melody[i], velocity);
      i++;
   }

   // Store a base line in track 2 on channel 1 (indexed from 0):
   i = 0;
   actiontick   = 0;
   velocity     = 90;
   channel      = 1;
   track        = 2;

   midifile.addTrackName(track, actiontick, "Bass line");
   midifile.addPatchChange(track, actiontick, channel, 58); // 58=tuba

   while (bass[i] >= 0) {
      midifile.addNoteOn(track, actiontick, channel, bass[i], velocity);
      actiontick += tpq * brhythm[i];
      midifile.addNoteOff(track, actiontick, channel, bass[i], velocity);
      i++;
   }

   midifile.sortTracks();         // ensure tick times are in correct order
   midifile.write("twinkle.mid"); // write Standard MIDI File twinkle.mid
   return 0;
}